

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.hh
# Opt level: O0

void __thiscall SF_FlateLzwDecode::SF_FlateLzwDecode(SF_FlateLzwDecode *this,bool lzw)

{
  bool lzw_local;
  SF_FlateLzwDecode *this_local;
  
  QPDFStreamFilter::QPDFStreamFilter(&this->super_QPDFStreamFilter);
  (this->super_QPDFStreamFilter)._vptr_QPDFStreamFilter =
       (_func_int **)&PTR__SF_FlateLzwDecode_0059edc0;
  this->lzw = lzw;
  this->predictor = 1;
  this->columns = 1;
  this->colors = 1;
  this->bits_per_component = 8;
  this->early_code_change = true;
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::vector
            (&this->pipelines);
  return;
}

Assistant:

SF_FlateLzwDecode(bool lzw) :
        lzw(lzw)
    {
    }